

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::Configurations::hasConfiguration(Configurations *this,ConfigurationType configurationType)

{
  anon_class_32_4_1fe0db86 local_60;
  function<bool_()> local_40;
  bool local_19;
  EnumType local_18;
  ConfigurationType CStack_14;
  bool result;
  EnumType lIndex;
  ConfigurationType configurationType_local;
  Configurations *this_local;
  
  local_18 = 2;
  local_19 = false;
  local_60.configurationType = &stack0xffffffffffffffec;
  local_60.result = &local_19;
  local_60.this = this;
  local_60.lIndex = &local_18;
  CStack_14 = configurationType;
  _lIndex = this;
  std::function<bool()>::
  function<el::Configurations::hasConfiguration(el::ConfigurationType)::__0,void>
            ((function<bool()> *)&local_40,&local_60);
  LevelHelper::forEachLevel(&local_18,&local_40);
  el::base::utils::std::function<bool_()>::~function(&local_40);
  return (bool)(local_19 & 1);
}

Assistant:

bool Configurations::hasConfiguration(ConfigurationType configurationType) {
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  bool result = false;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    if (hasConfiguration(LevelHelper::castFromInt(lIndex), configurationType)) {
      result = true;
    }
    return result;
  });
  return result;
}